

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavefront.cpp
# Opt level: O3

int __thiscall WAVEFRONT::BuildMesh::GetIndex(BuildMesh *this,float *p,float *texCoord)

{
  FloatVector *this_00;
  pointer pfVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  iterator iVar6;
  
  iVar6._M_current =
       (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pfVar1 = (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = (int)((ulong)((long)iVar6._M_current - (long)pfVar1) >> 2);
  iVar2 = iVar5 / 3;
  if (2 < iVar5) {
    pfVar4 = texCoord;
    if (texCoord != (float *)0x0) {
      pfVar4 = (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    pfVar3 = pfVar1 + 2;
    iVar5 = 0;
    do {
      if ((pfVar3[-2] == *p) && (!NAN(pfVar3[-2]) && !NAN(*p))) {
        if ((pfVar3[-1] == p[1]) && (!NAN(pfVar3[-1]) && !NAN(p[1]))) {
          if ((*pfVar3 == p[2]) && (!NAN(*pfVar3) && !NAN(p[2]))) {
            if (texCoord == (float *)0x0) {
              return iVar5;
            }
            if ((*pfVar4 == *texCoord) && (!NAN(*pfVar4) && !NAN(*texCoord))) {
              if ((pfVar4[1] == texCoord[1]) && (!NAN(pfVar4[1]) && !NAN(texCoord[1]))) {
                return iVar5;
              }
            }
          }
        }
      }
      if (pfVar4 != (float *)0x0) {
        pfVar4 = pfVar4 + 2;
      }
      iVar5 = iVar5 + 1;
      pfVar3 = pfVar3 + 3;
    } while (iVar2 != iVar5);
  }
  pfVar4 = (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  this_00 = &this->mVertices;
  if (iVar6._M_current == pfVar4) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)this_00,iVar6,p);
    iVar6._M_current =
         (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pfVar4 = (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar6._M_current = *p;
    iVar6._M_current = iVar6._M_current + 1;
    (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current;
  }
  if (iVar6._M_current == pfVar4) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)this_00,iVar6,p + 1);
    iVar6._M_current =
         (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pfVar4 = (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar6._M_current = p[1];
    iVar6._M_current = iVar6._M_current + 1;
    (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current;
  }
  if (iVar6._M_current == pfVar4) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)this_00,iVar6,p + 2);
  }
  else {
    *iVar6._M_current = p[2];
    (this->mVertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current + 1;
  }
  if (texCoord != (float *)0x0) {
    iVar6._M_current =
         (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pfVar4 = (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar6._M_current == pfVar4) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)&this->mTexCoords,iVar6,texCoord);
      iVar6._M_current =
           (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pfVar4 = (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar6._M_current = *texCoord;
      iVar6._M_current = iVar6._M_current + 1;
      (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current;
    }
    if (iVar6._M_current == pfVar4) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)&this->mTexCoords,iVar6,texCoord + 1);
    }
    else {
      *iVar6._M_current = texCoord[1];
      (this->mTexCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
  }
  return iVar2;
}

Assistant:

int GetIndex(const float *p, const float *texCoord)
	{

		int vcount = (int)mVertices.size()/3;

		if(vcount>0)
		{
			//New MS STL library checks indices in debug build, so zero causes an assert if it is empty.
			const float *v = &mVertices[0];
			const float *t = texCoord != NULL ? &mTexCoords[0] : NULL;

			for (int i=0; i<vcount; i++)
			{
				if ( v[0] == p[0] && v[1] == p[1] && v[2] == p[2] )
				{
					if (texCoord == NULL || (t[0] == texCoord[0] && t[1] == texCoord[1]))
					{
						return i;
					}
				}
				v+=3;
				if (t != NULL)
					t += 2;
			}
		}

		mVertices.push_back( p[0] );
		mVertices.push_back( p[1] );
		mVertices.push_back( p[2] );

		if (texCoord != NULL)
		{
			mTexCoords.push_back( texCoord[0] );
			mTexCoords.push_back( texCoord[1] );
		}

		return vcount;
	}